

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O1

bool ASN1Time_check_posix(ASN1_TIME *s,int64_t t)

{
  int iVar1;
  int sec;
  int day;
  tm stm;
  tm ttm;
  int local_88;
  int local_84;
  tm local_80;
  tm local_48;
  
  iVar1 = ASN1_STRING_type((ASN1_STRING *)s);
  if (iVar1 == 0x17) {
    iVar1 = asn1_utctime_to_tm(&local_80,s,1);
  }
  else {
    if (iVar1 != 0x18) {
      return false;
    }
    iVar1 = asn1_generalizedtime_to_tm(&local_80,s);
  }
  if (iVar1 != 0) {
    iVar1 = OPENSSL_posix_to_tm(t,&local_48);
    if ((iVar1 != 0) &&
       (iVar1 = OPENSSL_gmtime_diff(&local_84,&local_88,&local_48,&local_80), iVar1 != 0)) {
      return local_88 == 0 && local_84 == 0;
    }
  }
  return false;
}

Assistant:

static bool ASN1Time_check_posix(const ASN1_TIME *s, int64_t t) {
  struct tm stm, ttm;
  int day, sec;

  switch (ASN1_STRING_type(s)) {
    case V_ASN1_GENERALIZEDTIME:
      if (!asn1_generalizedtime_to_tm(&stm, s)) {
        return false;
      }
      break;
    case V_ASN1_UTCTIME:
      if (!asn1_utctime_to_tm(&stm, s, /*allow_timezone_offset=*/1)) {
        return false;
      }
      break;
    default:
      return false;
  }
  if (!OPENSSL_posix_to_tm(t, &ttm) ||
      !OPENSSL_gmtime_diff(&day, &sec, &ttm, &stm)) {
    return false;
  }
  return day == 0 && sec == 0;
}